

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall QtMWidgets::Picker::mousePressEvent(Picker *this,QMouseEvent *event)

{
  int iVar1;
  PickerPrivate *pPVar2;
  QPoint QVar3;
  
  iVar1 = *(int *)(event + 0x40);
  if (iVar1 == 1) {
    pPVar2 = (this->d).d;
    pPVar2->mouseWasMoved = false;
    pPVar2->mouseMoveDelta = 0;
    QVar3 = QMouseEvent::pos(event);
    ((this->d).d)->mousePos = QVar3;
    ((this->d).d)->leftMouseButtonPressed = true;
  }
  event[0xc] = (QMouseEvent)(iVar1 == 1);
  return;
}

Assistant:

void
Picker::mousePressEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		d->mouseWasMoved = false;
		d->mouseMoveDelta = 0;
		d->mousePos = event->pos();
		d->leftMouseButtonPressed = true;

		event->accept();
	}
	else
		event->ignore();
}